

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O0

void __thiscall
OpenMD::FCCOfR::collectHistogram
          (FCCOfR *this,vector<double,_std::allocator<double>_> *param_2,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *what,
          RealType distCOM)

{
  int iVar1;
  reference pvVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RDX;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  int whichBin;
  
  if (in_XMM0_Qa < *(double *)(in_RDI + 0x718)) {
    iVar1 = (int)(in_XMM0_Qa / *(double *)(in_RDI + 0x720));
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x7b8),(long)iVar1);
    *pvVar2 = *pvVar2 + 1;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[](in_RDX,4);
    dVar3 = std::real<double>((complex<double> *)0x147e14);
    if (dVar3 < -0.12) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2000),(long)iVar1);
      *pvVar2 = *pvVar2 + 1;
    }
  }
  return;
}

Assistant:

void FCCOfR::collectHistogram(std::vector<RealType>,
                                std::vector<ComplexType> what,
                                RealType distCOM) {
    if (distCOM < len_) {
      // Figure out where this distance goes...
      int whichBin = int(distCOM / deltaR_);
      RCount_[whichBin]++;

      if (real(what[4]) < -0.12) { WofR_[whichBin]++; }
    }
  }